

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private $field_list_type$ $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$boxed_type$>\n    ${$get$capitalized_name$List$}$() {\n  return $name$_;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_COUNT,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $repeated_get$(index);\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,variables,"private int $name$MemoizedSerializedSize = -1;\n");
    return;
  }
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "private $field_list_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $repeated_get$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (descriptor_->is_packed()) {
    printer->Print(variables_,
                   "private int $name$MemoizedSerializedSize = -1;\n");
  }
}